

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

void __thiscall indk::NeuralNet::doSyncNeuronStates(NeuralNet *this,string *name)

{
  _Base_ptr p_Var1;
  Neuron *this_00;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  int64_t iVar5;
  Receptor *pRVar6;
  Position *P;
  Position *this_01;
  _Rb_tree_header *p_Var7;
  long RID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  _Base_ptr __k;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->StateSyncList)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->StateSyncList)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
            ::find(&(this->Neurons)._M_t,iVar2._M_node + 1);
    p_Var7 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar3._M_node != p_Var7) {
      p_Var1 = iVar2._M_node[2]._M_parent;
      for (__k = *(_Base_ptr *)(iVar2._M_node + 2); __k != p_Var1; __k = __k + 1) {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                ::find(&(this->Neurons)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar4._M_node != p_Var7) {
          iVar5 = Neuron::getReceptorsCount(*(Neuron **)(iVar3._M_node + 2));
          if (0 < iVar5) {
            RID = 0;
            do {
              pRVar6 = Neuron::getReceptor(*(Neuron **)(iVar3._M_node + 2),RID);
              P = Neuron::Receptor::getPosf(pRVar6);
              pRVar6 = Neuron::getReceptor(*(Neuron **)(iVar4._M_node + 2),RID);
              this_01 = Neuron::Receptor::getPosf(pRVar6);
              Position::setPosition(this_01,P);
              RID = RID + 1;
              iVar5 = Neuron::getReceptorsCount(*(Neuron **)(iVar3._M_node + 2));
            } while (RID < iVar5);
          }
          this_00 = *(Neuron **)(iVar4._M_node + 2);
          iVar5 = Neuron::getTime(*(Neuron **)(iVar3._M_node + 2));
          Neuron::setTime(this_00,iVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doSyncNeuronStates(const std::string &name) {
    auto s = StateSyncList.find(name);
    if (s != StateSyncList.end()) {
        auto n1 = Neurons.find(s->first);
        if (n1 != Neurons.end()) {
            for (const auto& v: s->second) {
                auto n2 = Neurons.find(v);
                if (n2 != Neurons.end()) {
                    for (int i = 0; i < n1->second->getReceptorsCount(); i++) {
                        auto pos = n1 -> second -> getReceptor(i) -> getPosf();
                        n2 -> second -> getReceptor(i) -> getPosf() -> setPosition(pos);
                    }
                    n2 -> second -> setTime(n1->second->getTime());
                }
            }
        }
    }
}